

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O3

REF_STATUS ref_subdiv_mark_n(REF_SUBDIV ref_subdiv,REF_INT *n)

{
  uint uVar1;
  undefined8 uVar2;
  REF_EDGE ref_edge;
  char *pcVar3;
  long lVar4;
  REF_INT part;
  int local_2c;
  
  *n = 0;
  ref_edge = ref_subdiv->edge;
  if (0 < ref_edge->n) {
    lVar4 = 0;
    do {
      if (ref_subdiv->mark[lVar4] != 0) {
        uVar1 = ref_edge_part(ref_edge,(REF_INT)lVar4,&local_2c);
        if (uVar1 != 0) {
          pcVar3 = "edge part";
          uVar2 = 0xc4;
          goto LAB_001fdd2a;
        }
        if (local_2c == ref_subdiv->grid->mpi->id) {
          *n = *n + 1;
        }
      }
      lVar4 = lVar4 + 1;
      ref_edge = ref_subdiv->edge;
    } while (lVar4 < ref_edge->n);
  }
  uVar1 = ref_mpi_allsum(ref_subdiv->grid->mpi,n,1,1);
  if (uVar1 == 0) {
    uVar1 = 0;
  }
  else {
    pcVar3 = "allsum";
    uVar2 = 199;
LAB_001fdd2a:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",uVar2,
           "ref_subdiv_mark_n",(ulong)uVar1,pcVar3);
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_mark_n(REF_SUBDIV ref_subdiv, REF_INT *n) {
  REF_INT edge, part;

  *n = 0;
  for (edge = 0; edge < ref_edge_n(ref_subdiv_edge(ref_subdiv)); edge++)
    if (0 != ref_subdiv_mark(ref_subdiv, edge)) {
      RSS(ref_edge_part(ref_subdiv_edge(ref_subdiv), edge, &part), "edge part")
      if (part == ref_mpi_rank(ref_subdiv_mpi(ref_subdiv))) (*n)++;
    }
  RSS(ref_mpi_allsum(ref_subdiv_mpi(ref_subdiv), n, 1, REF_INT_TYPE), "allsum");

  return REF_SUCCESS;
}